

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_dist_wtd_convolve_x_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  int16_t *piVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  uint8_t uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int local_80;
  ulong local_78;
  
  cVar6 = (char)conv_params->round_1;
  cVar9 = (char)conv_params->round_0 + cVar6;
  if (0 < h) {
    pCVar4 = conv_params->dst;
    uVar2 = filter_params_x->taps;
    iVar14 = (1 << (0x16U - cVar9 & 0x1f)) + (1 << (0x15U - cVar9 & 0x1f));
    piVar5 = filter_params_x->filter_ptr;
    iVar3 = conv_params->dst_stride;
    local_80 = 1 - (uint)(uVar2 >> 1);
    local_78 = 0;
    do {
      if (0 < w) {
        lVar8 = local_78 * (long)iVar3;
        uVar15 = 0;
        iVar12 = local_80;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar13 = 0;
          }
          else {
            uVar10 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)src[uVar10 + (long)iVar12] *
                                (int)*(short *)((long)piVar5 +
                                               uVar10 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar10 = uVar10 + 1;
            } while (filter_params_x->taps != uVar10);
          }
          bVar1 = (byte)conv_params->round_0;
          iVar13 = ((((1 << (bVar1 & 0x1f)) >> 1) + iVar13 >> (bVar1 & 0x1f)) << (7U - cVar6 & 0x1f)
                   ) + iVar14;
          if (conv_params->do_average == 0) {
            pCVar4[lVar8 + uVar15] = (CONV_BUF_TYPE)iVar13;
          }
          else {
            uVar7 = (uint)pCVar4[lVar8 + uVar15];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar13 = (int)(iVar13 + uVar7) >> 1;
            }
            else {
              iVar13 = (int)(iVar13 * conv_params->bck_offset + uVar7 * conv_params->fwd_offset) >>
                       4;
            }
            iVar13 = iVar13 + (((1 << (0xeU - cVar9 & 0x1f)) >> 1) - iVar14) >>
                     (0xeU - cVar9 & 0x1f);
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            uVar11 = (uint8_t)iVar13;
            if (0xfe < iVar13) {
              uVar11 = 0xff;
            }
            dst[uVar15 + local_78 * (long)dst_stride] = uVar11;
          }
          uVar15 = uVar15 + 1;
          iVar12 = iVar12 + 1;
        } while (uVar15 != (uint)w);
      }
      local_78 = local_78 + 1;
      local_80 = local_80 + src_stride;
    } while (local_78 != (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_c(const uint8_t *src, int src_stride, uint8_t *dst,
                               int dst_stride, int w, int h,
                               const InterpFilterParams *filter_params_x,
                               const int subpel_x_qn,
                               ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}